

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O2

complex<double> __thiscall
TPZFMatrix<std::complex<double>_>::operator()
          (TPZFMatrix<std::complex<double>_> *this,int64_t row,int64_t col)

{
  long lVar1;
  complex<double> cVar2;
  
  lVar1 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  cVar2._M_value._9_7_ = (undefined7)((ulong)col >> 8);
  cVar2._M_value[8] = row < 0 || lVar1 <= row;
  if (((row >= 0 && lVar1 > row) && (-1 < col)) &&
     (col < (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol)) {
    cVar2._M_value._0_8_ = this->fElem + lVar1 * col;
    return (complex<double>)cVar2._M_value;
  }
  Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x278);
}

Assistant:

inline TVar TPZFMatrix<TVar>::operator()( const int64_t row, const int64_t col) const {
#ifndef PZNODEBUG
    if(row >=  this->Rows() || row<0 || col >=  this->Cols() || col<0) {
        Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        DebugStop();
    }
#endif
    return *(this->fElem+col*this->fRow+row);
}